

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_repeat_matcher.hpp
# Opt level: O1

bool __thiscall
boost::xpressive::detail::
simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::posix_charset_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>>,mpl_::bool_<true>>
::
match_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
          (simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::posix_charset_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>>,mpl_::bool_<true>>
           *this,long *state,long *next)

{
  simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::posix_charset_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>>,mpl_::bool_<true>>
  sVar1;
  ushort uVar2;
  uint uVar3;
  long lVar4;
  char cVar5;
  long lVar6;
  byte *pbVar7;
  long lVar8;
  bool bVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  
  lVar4 = *state;
  uVar3 = *(uint *)(this + 8);
  if (uVar3 == 0) {
    uVar11 = 0;
  }
  else {
    pbVar7 = (byte *)*state;
    sVar1 = *this;
    uVar2 = *(ushort *)(this + 2);
    iVar12 = (int)pbVar7;
    uVar10 = 0;
    do {
      if (pbVar7 == (byte *)state[4]) {
        *(undefined1 *)((long)state + 0x31) = 1;
        uVar11 = (int)(byte *)state[4] - iVar12;
        break;
      }
      uVar11 = uVar10;
      if (sVar1 == (simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::posix_charset_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>>,mpl_::bool_<true>>
                    )((*(ushort *)(state[10] + 0x10 + (ulong)*pbVar7 * 2) & uVar2) != 0)) break;
      pbVar7 = pbVar7 + 1;
      *state = (long)pbVar7;
      uVar10 = uVar10 + 1;
      uVar11 = uVar3;
    } while (uVar3 != uVar10);
  }
  if (this[0x18] ==
      (simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::posix_charset_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>>,mpl_::bool_<true>>
       )0x1) {
    lVar6 = (ulong)(state[4] != lVar4) + lVar4;
    lVar8 = lVar6;
    if (uVar11 < *(uint *)(this + 8)) {
      lVar8 = *state;
    }
    if (uVar11 != 0) {
      lVar6 = lVar8;
    }
    state[0x12] = lVar6;
  }
  if (uVar11 < *(uint *)(this + 4)) {
LAB_00135814:
    *state = lVar4;
    bVar9 = false;
  }
  else {
    cVar5 = (**(code **)(*next + 0x10))(next,state);
    bVar9 = true;
    if (cVar5 == '\0') {
      iVar12 = uVar11 + 1;
      do {
        iVar12 = iVar12 + -1;
        if (iVar12 == *(int *)(this + 4)) goto LAB_00135814;
        *state = *state + -1;
        cVar5 = (**(code **)(*next + 0x10))(next,state);
      } while (cVar5 == '\0');
    }
  }
  return bVar9;
}

Assistant:

bool match_(match_state<BidiIter> &state, Next const &next, greedy_slow_tag) const
        {
            int const diff = -static_cast<int>(Xpr::width == unknown_width::value ? this->width_ : Xpr::width);
            unsigned int matches = 0;
            BidiIter const tmp = state.cur_;

            // greedily match as much as we can
            while(matches < this->max_ && this->xpr_.match(state))
            {
                ++matches;
            }

            // If this repeater is at the front of the pattern, note
            // how much of the input we consumed so that a repeated search
            // doesn't have to cover the same ground again.
            if(this->leading_)
            {
                state.next_search_ = (matches && matches < this->max_)
                                   ? state.cur_
                                   : (tmp == state.end_) ? tmp : boost::next(tmp);
            }

            if(this->min_ > matches)
            {
                state.cur_ = tmp;
                return false;
            }

            // try matching the rest of the pattern, and back off if necessary
            for(; ; --matches, std::advance(state.cur_, diff))
            {
                if(next.match(state))
                {
                    return true;
                }
                else if(this->min_ == matches)
                {
                    state.cur_ = tmp;
                    return false;
                }
            }
        }